

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::splicePumpFrom
          (AsyncStreamFd *this,AsyncStreamFd *input,uint64_t readSoFar,uint64_t limit)

{
  AsyncInputStream node;
  int iVar1;
  PromiseBase PVar2;
  OwnPromiseNode extraout_RAX;
  uint64_t in_R8;
  OwnFd pipeOut;
  OwnFd pipeIn;
  int pipeFds [2];
  OwnFd local_54;
  Fault local_50;
  AsyncInputStream local_48;
  AsyncOutputStream AStack_40;
  int local_38;
  uint uStack_34;
  
  local_38 = 0;
  uStack_34 = 0;
  do {
    iVar1 = ::pipe2(&stack0xffffffffffffffc8,0x80800);
    if (-1 < iVar1) goto LAB_0043583a;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
LAB_0043583a:
    local_50.exception._0_4_ = local_38;
    local_54.fd = uStack_34;
    splicePumpLoop((AsyncStreamFd *)&stack0xffffffffffffffb8,input,(int)readSoFar,local_38,
                   (ulong)uStack_34,limit,in_R8);
    Promise<unsigned_long>::attach<kj::OwnFd,kj::OwnFd>
              ((Promise<unsigned_long> *)this,(OwnFd *)&stack0xffffffffffffffb8,(OwnFd *)&local_50);
    node._vptr_AsyncInputStream = local_48._vptr_AsyncInputStream;
    if ((PromiseArenaMember *)local_48._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
      local_48._vptr_AsyncInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_AsyncInputStream);
    }
    OwnFd::~OwnFd(&local_54);
    OwnFd::~OwnFd((OwnFd *)&local_50);
    PVar2.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX.ptr;
  }
  else {
    if (iVar1 != 0x17) {
      local_50.exception = (Exception *)0x0;
      local_48._vptr_AsyncInputStream = (_func_int **)0x0;
      AStack_40._vptr_AsyncOutputStream = (_func_int **)0x0;
      kj::_::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
    PVar2.node.ptr =
         (OwnPromiseNode)
         unoptimizedPumpTo((kj *)this,(AsyncInputStream *)readSoFar,
                           &(input->super_AsyncCapabilityStream).super_AsyncIoStream.
                            super_AsyncOutputStream,in_R8,limit);
  }
  return (Promise<unsigned_long>)PVar2.node.ptr;
}

Assistant:

Promise<uint64_t> splicePumpFrom(AsyncStreamFd& input, uint64_t readSoFar, uint64_t limit) {
    // splice() requires that either its input or its output is a pipe. But chances are neither
    // `input.fd` nor `this->fd` is a pipe -- in most use cases they are sockets. In order to take
    // advantage of splice(), then, we need to allocate a pipe to act as the middleman, so we can
    // splice() from the input to the pipe, and then from the pipe to the output.
    //
    // You might wonder why this pipe middleman is required. Why can't splice() go directly from
    // a socket to a socket? Linus Torvalds attempts to explain here:
    //     https://yarchive.net/comp/linux/splice.html
    //
    // The short version is that the pipe itself is equivalent to an in-memory buffer. In a naive
    // pump implementation, we allocate a buffer, read() into it and write() out. With splice(),
    // we allocate a kernelspace buffer by allocating a pipe, then we splice() into the pipe and
    // splice() back out.

    // Linux normally allocates pipe buffers of 64k (16 pages of 4k each). However, when
    // /proc/sys/fs/pipe-user-pages-soft is hit, then Linux will start allocating 4k (1 page)
    // buffers instead, and will give an error if we try to increase it.
    //
    // The soft limit defaults to 16384 pages, which we'd hit after 1024 pipes -- totally possible
    // in a big server. 64k is a nice buffer size, but even 4k is better than not using splice, so
    // we'll live with whatever buffer size the kernel gives us.
    //
    // There is a second, "hard" limit, /proc/sys/fs/pipe-user-pages-hard, at which point Linux
    // will start refusing to allocate pipes at all. In this case we fall back to an unoptimized
    // pump. However, this limit defaults to unlimited, so this won't ever happen unless someone
    // has manually changed the limit. That's probably dangerous since if the app allocates pipes
    // anywhere else in its codebase, it probably doesn't have any fallbacks in those places, so
    // things will break anyway... to avoid that we'd need to self-regulate the number of pipes
    // we allocate here to avoid coming close to the hard limit, but that's a lot of effort so I'm
    // not going to bother!

    int pipeFds[2]{};
    KJ_SYSCALL_HANDLE_ERRORS(pipe2(pipeFds, O_NONBLOCK | O_CLOEXEC)) {
      case ENFILE:
        // Probably hit the limit on pipe buffers, fall back to unoptimized pump.
        return unoptimizedPumpTo(input, *this, limit, readSoFar);
      default:
        KJ_FAIL_SYSCALL("pipe2()", error);
    }

    OwnFd pipeIn(pipeFds[0]), pipeOut(pipeFds[1]);

    return splicePumpLoop(input, pipeFds[0], pipeFds[1], readSoFar, limit, 0)
        .attach(kj::mv(pipeIn), kj::mv(pipeOut));
  }